

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

void __thiscall
snappy::SnappyDecompressor::DecompressAllTags<snappy::SnappyArrayWriter>
          (SnappyDecompressor *this,SnappyArrayWriter *writer)

{
  byte bVar1;
  ushort uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  ulong in_RAX;
  byte *pbVar6;
  undefined4 extraout_var;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  uint *puVar14;
  char *pcVar15;
  size_t n;
  ulong local_38;
  uint *__src;
  
  pbVar6 = (byte *)this->ip_;
  local_38 = in_RAX;
  if ((long)this->ip_limit_ - (long)pbVar6 < 5) {
    bVar4 = RefillTag(this);
    if (!bVar4) {
      return;
    }
    pbVar6 = (byte *)this->ip_;
  }
LAB_001510e4:
  do {
    __src = (uint *)(pbVar6 + 1);
    bVar1 = *pbVar6;
    if ((bVar1 & 3) == 0) {
      uVar11 = (ulong)(bVar1 >> 2) + 1;
      uVar9 = (long)this->ip_limit_ - (long)__src;
      pcVar15 = writer->op_;
      uVar7 = (long)writer->op_limit_ - (long)pcVar15;
      if ((0xf < uVar7 && 0x14 < uVar9) && bVar1 < 0x40) {
        *(undefined8 *)pcVar15 = *(undefined8 *)(pbVar6 + 1);
        *(undefined8 *)(pcVar15 + 8) = *(undefined8 *)(pbVar6 + 9);
        writer->op_ = pcVar15 + uVar11;
        pbVar6 = (byte *)((long)__src + uVar11);
        goto LAB_001510e4;
      }
      if (0xec < bVar1) {
        puVar14 = (uint *)((long)__src + ((ulong)(bVar1 >> 2) - 0x3b));
        uVar11 = (ulong)((*(uint *)(char_table + uVar11 * 4 + 0x110) & *__src) + 1);
        uVar9 = (long)this->ip_limit_ - (long)puVar14;
        __src = puVar14;
      }
      if (uVar9 < uVar11) {
        do {
          pcVar15 = writer->op_;
          if ((ulong)((long)writer->op_limit_ - (long)pcVar15) < uVar9) {
            return;
          }
          memcpy(pcVar15,__src,uVar9);
          writer->op_ = pcVar15 + uVar9;
          (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
          iVar5 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
          __src = (uint *)CONCAT44(extraout_var,iVar5);
          this->peeked_ = (uint32)local_38;
          if (local_38 == 0) {
            return;
          }
          uVar11 = uVar11 - uVar9;
          this->ip_limit_ = (char *)((long)__src + local_38);
          uVar9 = local_38;
        } while (local_38 < uVar11);
        pcVar15 = writer->op_;
        uVar7 = (long)writer->op_limit_ - (long)pcVar15;
      }
      if (uVar7 < uVar11) {
        return;
      }
      memcpy(pcVar15,__src,uVar11);
      writer->op_ = pcVar15 + uVar11;
      pbVar6 = (byte *)((long)__src + uVar11);
      if (4 < (long)this->ip_limit_ - (long)pbVar6) goto LAB_001510e4;
      this->ip_ = (char *)pbVar6;
    }
    else {
      pcVar15 = writer->op_;
      if (pcVar15 < writer->base_) {
        __assert_fail("op >= base_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/snappy/snappy.cc"
                      ,0x4b3,"bool snappy::SnappyArrayWriter::AppendFromSelf(size_t, size_t)");
      }
      uVar2 = *(ushort *)(char_table + (ulong)bVar1 * 2);
      uVar8 = (uVar2 & 0x700) + (*(uint *)(wordmask + (ulong)(uVar2 >> 0xb) * 4) & *__src);
      uVar9 = (ulong)uVar8;
      if ((ulong)((long)pcVar15 - (long)writer->base_) <= uVar9 - 1) {
        return;
      }
      uVar7 = (ulong)(uVar2 & 0xff);
      uVar11 = (long)writer->op_limit_ - (long)pcVar15;
      if ((uVar11 < 0x10 || 0x10 < (uVar2 & 0xff)) || uVar8 < 8) {
        if (uVar11 < uVar7 + 10) {
          if (uVar11 < uVar7) {
            return;
          }
          if ((uVar2 & 0xff) == 0) {
            __assert_fail("len > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/snappy/snappy.cc"
                          ,0x68,"void snappy::IncrementalCopy(const char *, char *, ssize_t)");
          }
          uVar11 = uVar7 + 1;
          pcVar13 = pcVar15;
          do {
            *pcVar13 = pcVar13[-uVar9];
            pcVar13 = pcVar13 + 1;
            uVar11 = uVar11 - 1;
          } while (1 < uVar11);
        }
        else {
          pcVar12 = pcVar15 + -uVar9;
          pcVar13 = pcVar15;
          uVar11 = uVar7;
          if (uVar8 < 8) {
            uVar3 = *(undefined8 *)pcVar12;
            do {
              *(undefined8 *)pcVar13 = uVar3;
              uVar11 = uVar11 - uVar9;
              pcVar13 = pcVar13 + uVar9;
              uVar9 = (long)pcVar13 - (long)pcVar12;
            } while ((long)uVar9 < 8);
          }
          if (0 < (long)uVar11) {
            uVar11 = uVar11 + 8;
            lVar10 = 0;
            do {
              *(undefined8 *)(pcVar13 + lVar10) = *(undefined8 *)(pcVar12 + lVar10);
              uVar11 = uVar11 - 8;
              lVar10 = lVar10 + 8;
            } while (8 < uVar11);
          }
        }
      }
      else {
        *(undefined8 *)pcVar15 = *(undefined8 *)(pcVar15 + -uVar9);
        *(undefined8 *)(pcVar15 + 8) = *(undefined8 *)(pcVar15 + (8 - uVar9));
      }
      pbVar6 = (byte *)((long)__src + (ulong)(uVar2 >> 0xb));
      writer->op_ = pcVar15 + uVar7;
      if (4 < (long)this->ip_limit_ - (long)pbVar6) goto LAB_001510e4;
      this->ip_ = (char *)pbVar6;
    }
    bVar4 = RefillTag(this);
    pbVar6 = (byte *)this->ip_;
    if (!bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void DecompressAllTags(Writer* writer) {
    const char* ip = ip_;

    // We could have put this refill fragment only at the beginning of the loop.
    // However, duplicating it at the end of each branch gives the compiler more
    // scope to optimize the <ip_limit_ - ip> expression based on the local
    // context, which overall increases speed.
    #define MAYBE_REFILL() \
        if (ip_limit_ - ip < kMaximumTagLength) { \
          ip_ = ip; \
          if (!RefillTag()) return; \
          ip = ip_; \
        }

    MAYBE_REFILL();
    for ( ;; ) {
      const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip++));

      if ((c & 0x3) == LITERAL) {
        size_t literal_length = (c >> 2) + 1u;
        if (writer->TryFastAppend(ip, ip_limit_ - ip, literal_length)) {
          assert(literal_length < 61);
          ip += literal_length;
          // NOTE(user): There is no MAYBE_REFILL() here, as TryFastAppend()
          // will not return true unless there's already at least five spare
          // bytes in addition to the literal.
          continue;
        }
        if (PREDICT_FALSE(literal_length >= 61)) {
          // Long literal.
          const size_t literal_length_length = literal_length - 60;
          literal_length =
              (LittleEndian::Load32(ip) & wordmask[literal_length_length]) + 1;
          ip += literal_length_length;
        }

        size_t avail = ip_limit_ - ip;
        while (avail < literal_length) {
          if (!writer->Append(ip, avail)) return;
          literal_length -= avail;
          reader_->Skip(peeked_);
          size_t n;
          ip = reader_->Peek(&n);
          avail = n;
          peeked_ = avail;
          if (avail == 0) return;  // Premature end of input
          ip_limit_ = ip + avail;
        }
        if (!writer->Append(ip, literal_length)) {
          return;
        }
        ip += literal_length;
        MAYBE_REFILL();
      } else {
        const uint32 entry = char_table[c];
        const uint32 trailer = LittleEndian::Load32(ip) & wordmask[entry >> 11];
        const uint32 length = entry & 0xff;
        ip += entry >> 11;

        // copy_offset/256 is encoded in bits 8..10.  By just fetching
        // those bits, we get copy_offset (since the bit-field starts at
        // bit 8).
        const uint32 copy_offset = entry & 0x700;
        if (!writer->AppendFromSelf(copy_offset + trailer, length)) {
          return;
        }
        MAYBE_REFILL();
      }
    }

#undef MAYBE_REFILL
  }